

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O2

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  IRBuilder *pIVar1;
  Value *cond;
  long lVar2;
  int extraout_EAX;
  MatchInstr *this_00;
  BasicBlock *pBVar3;
  Constant *label;
  BasicBlock *bb;
  long *plVar4;
  undefined4 in_register_00000034;
  long *plVar5;
  const_iterator __end3;
  allocator<char> local_71;
  long local_70;
  BasicBlock *local_68;
  string local_60;
  IRBuilder *local_40;
  long *local_38;
  
  local_70 = CONCAT44(in_register_00000034,__fd);
  (**(code **)(**(long **)(local_70 + 0x40) + 0x10))(*(long **)(local_70 + 0x40),this);
  cond = this->result_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"match.cont",&local_71);
  pIVar1 = &this->super_IRBuilder;
  local_68 = IRBuilder::createBlock(pIVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  lVar2 = local_70;
  this_00 = IRBuilder::createMatch(pIVar1,*(MatchClass *)(local_70 + 0x48),cond);
  plVar5 = (long *)(lVar2 + 0x50);
  local_40 = pIVar1;
  local_38 = plVar5;
  while (pIVar1 = local_40, pBVar3 = local_68, plVar5 = (long *)*plVar5, plVar5 != local_38) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"match.case",&local_71);
    pBVar3 = IRBuilder::createBlock(pIVar1,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    IRBuilder::setInsertPoint(pIVar1,pBVar3);
    codegen(this,(Stmt *)plVar5[5]);
    IRBuilder::createBr(pIVar1,local_68);
    plVar4 = plVar5 + 2;
    while (plVar4 = (long *)*plVar4, plVar4 != plVar5 + 2) {
      label = getConstant(this,(Expr *)plVar4[2]);
      MatchInstr::addCase(this_00,label,pBVar3);
    }
  }
  bb = local_68;
  if (*(long *)(local_70 + 0x68) != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"match.else",&local_71);
    bb = IRBuilder::createBlock(pIVar1,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    IRBuilder::setInsertPoint(pIVar1,bb);
    codegen(this,*(Stmt **)(local_70 + 0x68));
    IRBuilder::createBr(pIVar1,pBVar3);
  }
  MatchInstr::setElseBlock(this_00,bb);
  IRBuilder::setInsertPoint(pIVar1,pBVar3);
  return extraout_EAX;
}

Assistant:

void IRGenerator::accept(MatchStmt& matchStmt) {
  Value* cond = codegen(matchStmt.condition());
  BasicBlock* contBlock = createBlock("match.cont");
  MatchInstr* matchInstr = createMatch(matchStmt.op(), cond);

  for (const MatchStmt::Case& one : matchStmt.cases()) {
    BasicBlock* bb = createBlock("match.case");
    setInsertPoint(bb);
    codegen(one.second.get());
    createBr(contBlock);

    for (auto& labelNode : one.first) {
      Constant* label = getConstant(labelNode.get());
      matchInstr->addCase(label, bb);
    }
  }

  if (matchStmt.elseStmt()) {
    BasicBlock* elseBlock = createBlock("match.else");
    setInsertPoint(elseBlock);
    codegen(matchStmt.elseStmt());
    createBr(contBlock);

    matchInstr->setElseBlock(elseBlock);
  } else {
    matchInstr->setElseBlock(contBlock);
  }

  setInsertPoint(contBlock);
}